

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

uint32_t __thiscall
slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>::
insertFrom(LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *this,uint32_t i,
          uint32_t size,interval<unsigned_long> *key,Expression **value)

{
  unsigned_long *in_RCX;
  uint in_EDX;
  uint in_ESI;
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
  *in_RDI;
  undefined8 *in_R8;
  uint32_t local_4;
  
  if (in_ESI == 5) {
    local_4 = 6;
  }
  else {
    if (in_ESI != in_EDX) {
      if (in_EDX == 5) {
        return 6;
      }
      NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      ::moveRight(in_RDI,in_ESI,in_ESI + 1,in_EDX - in_ESI);
    }
    in_RDI->first[in_ESI].left = *in_RCX;
    in_RDI->first[in_ESI].right = in_RCX[1];
    in_RDI->second[in_ESI] = (Expression *)*in_R8;
    local_4 = in_EDX + 1;
  }
  return local_4;
}

Assistant:

uint32_t LeafNode<TKey, TValue, Capacity, _IsRoot>::insertFrom(uint32_t i, uint32_t size,
                                                               const interval<TKey>& key,
                                                               const TValue& value) {
    SLANG_ASSERT(i <= size && size <= Capacity);
    SLANG_ASSERT(key.left <= key.right);
    SLANG_ASSERT(i == 0 || keyAt(i - 1).left < key.left);
    SLANG_ASSERT(i == size || !(keyAt(i).left < key.left));

    // If we're at capacity we can't insert another element.
    if (i == Capacity)
        return Capacity + 1;

    if (i != size) {
        // We're inserting in the middle -- make sure we have room.
        if (size == Capacity)
            return Capacity + 1;

        this->moveRight(i, i + 1, size - i);
    }

    this->first[i] = key;
    this->second[i] = value;
    return size + 1;
}